

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::Args(Args *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x88);
  std::__cxx11::string::string(in_RDI + 0xb0);
  *(undefined8 *)(in_RDI + 0x40) = 0x3fa999999999999a;
  *(undefined4 *)(in_RDI + 0x4c) = 100;
  *(undefined4 *)(in_RDI + 0x50) = 5;
  *(undefined4 *)(in_RDI + 0x54) = 5;
  *(undefined4 *)(in_RDI + 0x58) = 5;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 5;
  *(undefined4 *)(in_RDI + 100) = 1;
  *(undefined4 *)(in_RDI + 0x68) = 2;
  *(undefined4 *)(in_RDI + 0x6c) = 2;
  *(undefined4 *)(in_RDI + 0x70) = 2000000;
  *(undefined4 *)(in_RDI + 0x74) = 3;
  *(undefined4 *)(in_RDI + 0x78) = 6;
  *(undefined4 *)(in_RDI + 0x7c) = 0xc;
  *(undefined4 *)(in_RDI + 0x48) = 100;
  *(undefined8 *)(in_RDI + 0x80) = 0x3f1a36e2eb1c432d;
  std::__cxx11::string::operator=(in_RDI + 0x88,"__label__");
  *(undefined4 *)(in_RDI + 0xa8) = 2;
  std::__cxx11::string::operator=(in_RDI + 0xb0,"");
  in_RDI[0xd0] = (string)0x0;
  in_RDI[0xd1] = (string)0x0;
  in_RDI[0xd2] = (string)0x0;
  in_RDI[0xd3] = (string)0x0;
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = 2;
  return;
}

Assistant:

Args::Args() {
  lr = 0.05;
  dim = 100;
  ws = 5;
  epoch = 5;
  minCount = 5;
  minCountLabel = 0;
  neg = 5;
  wordNgrams = 1;
  loss = loss_name::ns;
  model = model_name::sg;
  bucket = 2000000;
  minn = 3;
  maxn = 6;
  thread = 12;
  lrUpdateRate = 100;
  t = 1e-4;
  label = "__label__";
  verbose = 2;
  pretrainedVectors = "";
  saveOutput = false;

  qout = false;
  retrain = false;
  qnorm = false;
  cutoff = 0;
  dsub = 2;
}